

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadLabel(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus In;
  uint64_t uVar6;
  uint32_t in_ESI;
  MCInst *in_RDI;
  byte bVar7;
  _Bool hasV7Ops;
  uint64_t featureBits;
  int imm;
  uint U;
  uint Rt;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  uint RegNo;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  
  local_2c[0] = MCDisassembler_Success;
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(local_14,0x17,1);
  uVar4 = fieldFromInstruction_4(local_14,0,0xc);
  uVar6 = ARM_getFeatureBits(local_10->csh->mode);
  RegNo = (uint)(uVar6 >> 0x20);
  bVar7 = (uVar6 & 0x10000000000) != 0;
  if (uVar2 == 0xf) {
    uVar5 = MCInst_getOpcode(local_10);
    in_stack_ffffffffffffffb0 = (void *)(ulong)(uVar5 - 0x94f);
    switch(in_stack_ffffffffffffffb0) {
    case (void *)0x0:
    case (void *)0xf:
      MCInst_setOpcode(local_10,0x9b9);
      break;
    default:
      break;
    case (void *)0x17:
      MCInst_setOpcode(local_10,0x9bd);
      break;
    case (void *)0x1f:
      return MCDisassembler_Fail;
    }
  }
  uVar5 = MCInst_getOpcode(local_10);
  if (uVar5 != 0x9b9) {
    if (uVar5 == 0x9bd) {
      if ((bVar7 & 1) == 0) {
        return MCDisassembler_Fail;
      }
    }
    else {
      In = DecodeGPRRegisterClass
                     ((MCInst *)CONCAT44(uVar3,uVar4),RegNo,
                      CONCAT17(bVar7,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
      _Var1 = Check(local_2c,In);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  if (uVar3 == 0) {
    if (uVar4 == 0) {
      uVar4 = 0x80000000;
    }
    else {
      uVar4 = -uVar4;
    }
  }
  MCOperand_CreateImm0(local_10,(long)(int)uVar4);
  return local_2c[0];
}

Assistant:

static DecodeStatus DecodeT2LoadLabel(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	int imm = fieldFromInstruction_4(Insn, 0, 12);
	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBpci:
			case ARM_t2LDRHpci:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2LDRSBpci:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			case ARM_t2LDRSHpci:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch(MCInst_getOpcode(Inst)) {
		case ARM_t2PLDpci:
			break;
		case ARM_t2PLIpci:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!U) {
		// Special case for #-0.
		if (imm == 0)
			imm = INT32_MIN;
		else
			imm = -imm;
	}
	MCOperand_CreateImm0(Inst, imm);

	return S;
}